

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall
ithipublisher::GetAverageAndCurrent
          (ithipublisher *this,char *metric_name,char *key_value,double *average,double *current)

{
  bool bVar1;
  reference pvVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int local_6c;
  double dStack_68;
  int i;
  double sum;
  undefined1 local_48 [7];
  bool ret;
  vector<double,_std::allocator<double>_> val;
  double *current_local;
  double *average_local;
  char *key_value_local;
  char *metric_name_local;
  ithipublisher *this_local;
  
  val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = current;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  bVar1 = GetVector(this,metric_name,key_value,(vector<double,_std::allocator<double>_> *)local_48);
  dStack_68 = 0.0;
  *average = 0.0;
  *val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_end_of_storage = 0.0;
  if (bVar1) {
    if (1 < this->nb_months) {
      for (local_6c = 0; local_6c < this->nb_months + -1; local_6c = local_6c + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_48,(long)local_6c);
        dStack_68 = *pvVar2 + dStack_68;
      }
      lVar3 = (long)this->nb_months + -1;
      auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar4._0_8_ = lVar3;
      auVar4._12_4_ = 0x45300000;
      *average = dStack_68 /
                 ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_48,
                        (long)this->nb_months - 1);
    *val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_end_of_storage = *pvVar2;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return bVar1;
}

Assistant:

bool ithipublisher::GetAverageAndCurrent(char const * metric_name, char const * key_value, double * average, double * current)
{
    std::vector<double>  val;
    bool ret = GetVector(metric_name, key_value, &val);
    double sum = 0;

    *average = 0;
    *current = 0;

    if (ret)
    {
        if (nb_months > 1)
        {
            for (int i = 0; i < nb_months - 1; i++)
            {
                sum += val[i];
            }
            *average = sum / (double)(((size_t)nb_months) - 1);
        }

        *current = val[(size_t)nb_months - 1];
    }
    
    return ret;
}